

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O1

void highbd_quantize_fp_helper_c
               (tran_low_t *coeff_ptr,intptr_t count,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  undefined4 local_64;
  int local_50 [8];
  int log_scaled_round_arr [2];
  
  bVar5 = (byte)iscan;
  if (eob_ptr == (uint16_t *)0x0 && scan == (int16_t *)0x0) {
    iVar3 = (1 << (bVar5 & 0x1f)) >> 1;
    local_50[0] = *zbin_ptr + iVar3 >> (bVar5 & 0x1f);
    local_50[1] = zbin_ptr[1] + iVar3 >> (bVar5 & 0x1f);
    if (0 < count) {
      local_64 = 0xffffffff;
      lVar12 = 0;
      do {
        lVar11 = (long)dequant_ptr[lVar12];
        uVar4 = (ulong)(lVar11 != 0);
        iVar3 = coeff_ptr[lVar11];
        iVar6 = -iVar3;
        if (0 < iVar3) {
          iVar6 = iVar3;
        }
        iVar10 = (int)*(short *)((long)qcoeff_ptr + uVar4 * 2);
        if (iVar6 << (bVar5 + 1 & 0x1f) < iVar10) {
          (quant_ptr + lVar11 * 2)[0] = 0;
          (quant_ptr + lVar11 * 2)[1] = 0;
          iVar3 = 0;
        }
        else {
          uVar8 = iVar3 >> 0x1f;
          uVar2 = (uint)(((long)iVar6 + (long)local_50[uVar4]) * (long)round_ptr[uVar4] >>
                        (0x10 - bVar5 & 0x3f));
          *(uint *)(quant_ptr + lVar11 * 2) = (uVar8 ^ uVar2) - uVar8;
          if (uVar2 != 0) {
            local_64 = (undefined4)lVar12;
          }
          iVar3 = ((int)(iVar10 * uVar2) >> (bVar5 & 0x1f) ^ uVar8) - uVar8;
        }
        *(int *)(quant_shift_ptr + lVar11 * 2) = iVar3;
        lVar12 = lVar12 + 1;
      } while (count != lVar12);
      goto LAB_001939fa;
    }
  }
  else if (0 < count) {
    local_64 = 0xffffffff;
    lVar12 = 0;
    do {
      sVar1 = dequant_ptr[lVar12];
      lVar11 = (long)sVar1;
      if (eob_ptr == (uint16_t *)0x0) {
        uVar4 = 0x20;
      }
      else {
        uVar4 = (ulong)*(byte *)((long)eob_ptr + lVar11);
      }
      if (scan == (int16_t *)0x0) {
        uVar8 = 0x20;
      }
      else {
        uVar8 = (uint)*(byte *)((long)scan + lVar11);
      }
      iVar3 = coeff_ptr[lVar11];
      iVar10 = (int)*(short *)((long)qcoeff_ptr + (ulong)(sVar1 != 0) * 2);
      iVar6 = -iVar3;
      if (0 < iVar3) {
        iVar6 = iVar3;
      }
      if ((long)(uVar4 * (long)iVar6) < (long)(iVar10 << (4 - bVar5 & 0x1f))) {
        (quant_ptr + lVar11 * 2)[0] = 0;
        (quant_ptr + lVar11 * 2)[1] = 0;
        (quant_shift_ptr + lVar11 * 2)[0] = 0;
        (quant_shift_ptr + lVar11 * 2)[1] = 0;
      }
      else {
        uVar9 = (ulong)((uint)(sVar1 != 0) * 2);
        uVar7 = iVar3 >> 0x1f;
        uVar2 = (uint)((long)(uVar4 * (long)*(short *)((long)round_ptr + uVar9) *
                             ((long)((int)*(short *)((long)zbin_ptr + uVar9) +
                                     ((1 << (bVar5 & 0x1f)) >> 1) >> (bVar5 & 0x1f)) + (long)iVar6))
                      >> (0x15 - bVar5 & 0x3f));
        *(uint *)(quant_ptr + lVar11 * 2) = (uVar7 ^ uVar2) - uVar7;
        *(uint *)(quant_shift_ptr + lVar11 * 2) =
             ((int)(((int)(uVar8 * iVar10 + 0x10) >> 5) * uVar2) >> (bVar5 & 0x1f) ^ uVar7) - uVar7;
        if (uVar2 != 0) {
          local_64 = (undefined4)lVar12;
        }
      }
      lVar12 = lVar12 + 1;
    } while (count != lVar12);
    goto LAB_001939fa;
  }
  local_64._0_2_ = -1;
LAB_001939fa:
  *(short *)dqcoeff_ptr = (short)local_64 + 1;
  return;
}

Assistant:

static void highbd_quantize_fp_helper_c(
    const tran_low_t *coeff_ptr, intptr_t count, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, int log_scale) {
  int i;
  int eob = -1;
  const int shift = 16 - log_scale;
  // TODO(jingning) Decide the need of these arguments after the
  // quantization process is completed.
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  (void)iscan;

  if (qm_ptr || iqm_ptr) {
    // Quantization pass: All coefficients with index >= zero_flag are
    // skippable. Note: zero_flag can be zero.
    for (i = 0; i < count; i++) {
      const int rc = scan[i];
      const int coeff = coeff_ptr[rc];
      const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const qm_val_t iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const int coeff_sign = AOMSIGN(coeff);
      const int64_t abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      int abs_qcoeff = 0;
      if (abs_coeff * wt >=
          (dequant_ptr[rc != 0] << (AOM_QM_BITS - (1 + log_scale)))) {
        const int64_t tmp =
            abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale);
        abs_qcoeff =
            (int)((tmp * quant_ptr[rc != 0] * wt) >> (shift + AOM_QM_BITS));
        qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
        const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
        dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
        if (abs_qcoeff) eob = i;
      } else {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
      }
    }
  } else {
    const int log_scaled_round_arr[2] = {
      ROUND_POWER_OF_TWO(round_ptr[0], log_scale),
      ROUND_POWER_OF_TWO(round_ptr[1], log_scale),
    };
    for (i = 0; i < count; i++) {
      const int rc = scan[i];
      const int coeff = coeff_ptr[rc];
      const int rc01 = (rc != 0);
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int log_scaled_round = log_scaled_round_arr[rc01];
      if ((abs_coeff << (1 + log_scale)) >= dequant_ptr[rc01]) {
        const int quant = quant_ptr[rc01];
        const int dequant = dequant_ptr[rc01];
        const int64_t tmp = (int64_t)abs_coeff + log_scaled_round;
        const int abs_qcoeff = (int)((tmp * quant) >> shift);
        qcoeff_ptr[rc] = (tran_low_t)((abs_qcoeff ^ coeff_sign) - coeff_sign);
        const tran_low_t abs_dqcoeff = (abs_qcoeff * dequant) >> log_scale;
        if (abs_qcoeff) eob = i;
        dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);
      } else {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
      }
    }
  }
  *eob_ptr = eob + 1;
}